

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransArray.h
# Opt level: O0

void __thiscall TransArray::flushbuf(TransArray *this,int fd,int use_seq,int pos)

{
  int iVar1;
  reference pvVar2;
  int *__buf;
  ulong uVar3;
  runtime_error *this_00;
  ssize_t res;
  int wblk;
  int pos_local;
  int use_seq_local;
  int fd_local;
  TransArray *this_local;
  
  pvVar2 = std::vector<long,_std::allocator<long>_>::operator[](&this->offset,(long)pos);
  lseek(fd,*pvVar2 << 2,0);
  iVar1 = this->theSize;
  if (0 < iVar1) {
    __buf = std::vector<int,_std::allocator<int>_>::data(&this->theArray);
    uVar3 = write(fd,__buf,(long)iVar1 << 2);
    if (uVar3 < (ulong)((long)iVar1 << 2)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Error writing");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pvVar2 = std::vector<long,_std::allocator<long>_>::operator[](&this->offset,(long)pos);
    *pvVar2 = (long)iVar1 + *pvVar2;
  }
  this->theSize = 0;
  return;
}

Assistant:

void flushbuf(int fd, int use_seq, int pos = 0) {
        lseek(fd, offset[pos] * sizeof(int), SEEK_SET);
        int wblk = theSize;
        if (wblk > 0) {
            auto res = write(fd, (char *) theArray.data(), wblk * sizeof(int));
            if (res < wblk * sizeof(int)) {
                throw runtime_error("Error writing");
            }
            offset[pos] += wblk;
        }
        theSize = 0;
    }